

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O1

IHEVCD_ERROR_T ihevcd_scaling_list_data(codec_t *ps_codec,WORD16 *pi2_scaling_mat)

{
  ulong uVar1;
  WORD16 *__dest;
  byte bVar2;
  void *pvVar3;
  byte bVar4;
  WORD16 WVar5;
  WORD16 WVar6;
  UWORD32 UVar7;
  WORD32 WVar8;
  uint uVar9;
  int iVar10;
  UWORD32 UVar11;
  UWORD32 UVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bitstrm_t *ps_bitstrm;
  long lVar19;
  undefined1 auVar20 [16];
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  uVar17 = 0;
  do {
    bVar4 = (char)uVar17 * '\x02';
    uVar15 = 0x10 << ((char)uVar17 * '\x02' & 0x1fU);
    if (0x3f < uVar15) {
      uVar15 = 0x40;
    }
    uVar16 = (ulong)(uVar15 + (uVar15 == 0));
    uVar1 = uVar17 + 1;
    lVar19 = 0;
    do {
      UVar7 = ihevcd_bits_get(ps_bitstrm,1);
      __dest = pi2_scaling_mat + *(int *)(&DAT_001706a0 + (uVar17 * 6 + lVar19) * 4);
      if (UVar7 == 0) {
        UVar11 = ihevcd_uev(ps_bitstrm);
        UVar7 = 0;
        if (0 < (int)UVar11) {
          UVar7 = UVar11;
        }
        UVar12 = (UWORD32)lVar19;
        if ((int)UVar11 <= lVar19) {
          UVar12 = UVar7;
        }
        if (UVar12 != 0) {
          memcpy(__dest,__dest + -(long)(int)(UVar12 << (bVar4 + 4 & 0x1f)),
                 (ulong)(uint)(0x20 << (bVar4 & 0x1f)));
        }
      }
      else {
        iVar10 = 8;
        if (uVar17 < 2) {
          pvVar3 = gapv_ihevc_invscan[uVar1];
          uVar18 = 0;
          do {
            WVar8 = ihevcd_sev(ps_bitstrm);
            uVar9 = WVar8 + iVar10 + 0x100;
            uVar15 = WVar8 + iVar10 + 0x1ff;
            if (-1 < (int)uVar9) {
              uVar15 = uVar9;
            }
            iVar10 = uVar9 - (uVar15 & 0xffffff00);
            __dest[*(byte *)((long)pvVar3 + uVar18)] = (WORD16)iVar10;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        else {
          WVar8 = ihevcd_sev(ps_bitstrm);
          pvVar3 = gapv_ihevc_invscan[2];
          uVar15 = WVar8 + 8;
          WVar5 = (WORD16)uVar15;
          if (uVar17 == 2) {
            uVar18 = 0;
            do {
              WVar8 = ihevcd_sev(ps_bitstrm);
              uVar9 = WVar8 + uVar15 + 0x100;
              uVar15 = WVar8 + uVar15 + 0x1ff;
              if (-1 < (int)uVar9) {
                uVar15 = uVar9;
              }
              uVar15 = uVar9 - (uVar15 & 0xffffff00);
              bVar2 = *(byte *)((long)pvVar3 + uVar18);
              uVar13 = (ulong)(((uint)bVar2 + (uint)bVar2 & 0xe) + (bVar2 & 0xfffffff8) * 4);
              WVar6 = (WORD16)uVar15;
              __dest[uVar13] = WVar6;
              __dest[uVar13 + 1] = WVar6;
              __dest[uVar13 + 0x10] = WVar6;
              __dest[uVar13 + 0x11] = WVar6;
              uVar18 = uVar18 + 1;
            } while (uVar16 != uVar18);
            *__dest = WVar5;
          }
          else {
            uVar18 = 0;
            do {
              WVar8 = ihevcd_sev(ps_bitstrm);
              uVar9 = WVar8 + uVar15 + 0x100;
              uVar15 = WVar8 + uVar15 + 0x1ff;
              if (-1 < (int)uVar9) {
                uVar15 = uVar9;
              }
              uVar15 = uVar9 - (uVar15 & 0xffffff00);
              uVar9 = (uint)*(byte *)((long)pvVar3 + uVar18);
              auVar20 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
              lVar14 = 0;
              do {
                *(long *)((long)__dest +
                         lVar14 + (ulong)((uVar9 & 0xffffff8) * 0x10 + (uVar9 & 7) * 4) * 2) =
                     auVar20._0_8_;
                lVar14 = lVar14 + 0x40;
              } while (lVar14 != 0x100);
              *__dest = WVar5;
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar16);
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != (ulong)(uVar17 != 3) * 4 + 2);
    uVar17 = uVar1;
  } while (uVar1 != 4);
  return 0;
}

Assistant:

IHEVCD_ERROR_T  ihevcd_scaling_list_data(codec_t *ps_codec, WORD16 *pi2_scaling_mat)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 size_id;
    WORD32 matrix_id;
    WORD32 value, dc_value = 0;
    WORD32 next_coef;
    WORD32 coef_num;
    WORD32 i, j, offset;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD16 *pi2_scaling_mat_offset;
    WORD32 scaling_mat_offset[] = { 0, 16, 32, 48, 64, 80, 96, 160, 224, 288, 352, 416, 480, 736, 992, 1248, 1504, 1760, 2016, 3040 };
    UWORD8 *scan_table;

    for(size_id = 0; size_id < 4; size_id++)
    {
        for(matrix_id = 0; matrix_id < ((size_id == 3) ? 2 : 6); matrix_id++)
        {
            WORD32 scaling_list_pred_mode_flag;
            WORD32 scaling_list_delta_coef;
            BITS_PARSE("scaling_list_pred_mode_flag", scaling_list_pred_mode_flag, ps_bitstrm, 1);

            offset = size_id * 6 + matrix_id;
            pi2_scaling_mat_offset = pi2_scaling_mat + scaling_mat_offset[offset];

            if(!scaling_list_pred_mode_flag)
            {
                WORD32 num_elements;
                UEV_PARSE("scaling_list_pred_matrix_id_delta", value,
                          ps_bitstrm);
                value = CLIP3(value, 0, matrix_id);

                num_elements = (1 << (4 + (size_id << 1)));
                if(0 != value)
                    memcpy(pi2_scaling_mat_offset, pi2_scaling_mat_offset - value * num_elements, num_elements * sizeof(WORD16));
            }
            else
            {
                next_coef = 8;
                coef_num = MIN(64, (1 << (4 + (size_id << 1))));

                if(size_id > 1)
                {
                    SEV_PARSE("scaling_list_dc_coef_minus8", value,
                              ps_bitstrm);

                    next_coef = value + 8;
                    dc_value = next_coef;
                }
                if(size_id < 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[size_id + 1];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;
                        pi2_scaling_mat_offset[scan_table[i]] = next_coef;
                    }
                }
                else if(size_id == 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 16 * 2 + (offset & 0x7) * 2;
                        pi2_scaling_mat_offset[offset] = next_coef;
                        pi2_scaling_mat_offset[offset + 1] = next_coef;
                        pi2_scaling_mat_offset[offset + 16] = next_coef;
                        pi2_scaling_mat_offset[offset + 16 + 1] = next_coef;
                    }
                    pi2_scaling_mat_offset[0] = dc_value;
                }
                else
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 32 * 4 + (offset & 0x7) * 4;

                        for(j = 0; j < 4; j++)
                        {
                            pi2_scaling_mat_offset[offset + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 1 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 2 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 3 + j * 32] = next_coef;
                        }
                        pi2_scaling_mat_offset[0] = dc_value;
                    }
                }
            }
        }
    }

    return ret;
}